

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O3

int tchecker::zg::path::symbolic::lexical_cmp(node_t *n1,node_t *n2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  state_t *s1;
  state_t *s2;
  uint uVar5;
  
  s1 = (state_t *)(n1->super_node_zg_state_t)._state._t;
  if ((s1 != (state_t *)0x0) &&
     (s2 = (state_t *)(n2->super_node_zg_state_t)._state._t, s2 != (state_t *)0x0)) {
    uVar5 = ta::lexical_cmp(s1,s2);
    if (uVar5 == 0) {
      bVar1 = (n1->super_node_flags_t).NODE_INITIAL;
      bVar2 = (n1->super_node_flags_t)._flags;
      bVar3 = (n2->super_node_flags_t).NODE_INITIAL;
      bVar4 = (n2->super_node_flags_t)._flags;
      if (((bVar1 & bVar2) != 0) == ((bVar3 & bVar4) != 0)) {
        uVar5 = (uint)(((n2->super_node_flags_t).NODE_FINAL & bVar4) != 0 &&
                      ((n1->super_node_flags_t).NODE_FINAL & bVar2) == 0);
      }
      else {
        uVar5 = (uint)((bVar1 & bVar2) == 0 && (bVar3 & bVar4) != 0);
      }
    }
    return uVar5;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,
                "T &tchecker::intrusive_shared_ptr_t<const tchecker::make_shared_t<tchecker::zg::state_t>>::operator*() const [T = const tchecker::make_shared_t<tchecker::zg::state_t>]"
               );
}

Assistant:

int lexical_cmp(tchecker::zg::path::symbolic::node_t const & n1, tchecker::zg::path::symbolic::node_t const & n2)
{
  int state_cmp = tchecker::ta::lexical_cmp(static_cast<tchecker::ta::state_t const &>(n1.state()),
                                            static_cast<tchecker::ta::state_t const &>(n2.state()));
  if (state_cmp != 0)
    return state_cmp;
  if (n1.initial() != n2.initial())
    return n1.initial() < n2.initial();
  return n1.final() < n2.final();
}